

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void Test_Template_StringGetTemplate::Run(void)

{
  char cVar1;
  Template *tpl;
  Template *pTVar2;
  long lVar3;
  TemplateString local_c0;
  TemplateString local_a0;
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_c0,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_c0,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_c0,"tgt");
  ctemplate::TemplateString::TemplateString(&local_a0,"{This is perfectly valid} yay!");
  cVar1 = ctemplate::Template::StringToTemplateCache(&local_c0,&local_a0);
  if (cVar1 == '\0') {
    printf("ASSERT FAILED, line %d: %s\n",0x48e,"Template::StringToTemplateCache(\"tgt\", tpltext)")
    ;
    ctemplate::TemplateString::TemplateString(&local_c0,"tgt");
    ctemplate::TemplateString::TemplateString(&local_a0,"{This is perfectly valid} yay!");
    cVar1 = ctemplate::Template::StringToTemplateCache(&local_c0,&local_a0);
    if (cVar1 == '\0') {
      __assert_fail("Template::StringToTemplateCache(\"tgt\", tpltext)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x48e,"static void Test_Template_StringGetTemplate::Run()");
    }
  }
  else {
    ctemplate::TemplateString::TemplateString(&local_c0,"tgt");
    tpl = (Template *)ctemplate::Template::GetTemplate(&local_c0,DO_NOT_STRIP);
    ctemplate::TemplateString::TemplateString(&local_c0,"tgt");
    pTVar2 = (Template *)ctemplate::Template::GetTemplate(&local_c0,STRIP_WHITESPACE);
    if ((tpl == (Template *)0x0) || (pTVar2 == (Template *)0x0)) {
      printf("ASSERT FAILED, line %d: %s\n",0x492,"tpl1 && tpl2");
      __assert_fail("tpl1 && tpl2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x492,"static void Test_Template_StringGetTemplate::Run()");
    }
    if (tpl == pTVar2) {
      printf("ASSERT FAILED, line %d: %s\n",0x493,"tpl1 != tpl2");
      __assert_fail("tpl1 != tpl2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x493,"static void Test_Template_StringGetTemplate::Run()");
    }
    std::__cxx11::string::string
              ((string *)&local_c0,"{This is perfectly valid} yay!",(allocator *)&local_a0);
    ctemplate::AssertExpandIs(tpl,&dict,(string *)&local_c0,true);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string
              ((string *)&local_c0,"{This is perfectly valid} yay!",(allocator *)&local_a0);
    ctemplate::AssertExpandIs(pTVar2,&dict,(string *)&local_c0,true);
    std::__cxx11::string::~string((string *)&local_c0);
    ctemplate::TemplateString::TemplateString(&local_c0,"tgt");
    ctemplate::TemplateString::TemplateString(&local_a0,"{This is perfectly valid} yay!");
    cVar1 = ctemplate::Template::StringToTemplateCache(&local_c0,&local_a0);
    if (cVar1 == '\0') {
      ctemplate::TemplateString::TemplateString(&local_c0,"tgt");
      ctemplate::TemplateString::TemplateString(&local_a0,"new text");
      cVar1 = ctemplate::Template::StringToTemplateCache(&local_c0,&local_a0);
      if (cVar1 == '\0') {
        ctemplate::TemplateString::TemplateString(&local_c0,"tgt");
        pTVar2 = (Template *)ctemplate::Template::GetTemplate(&local_c0,DO_NOT_STRIP);
        if (pTVar2 != tpl) {
          printf("ASSERT FAILED, line %d: %s\n",0x49c,"tpl3 == tpl1");
          __assert_fail("tpl3 == tpl1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                        ,0x49c,"static void Test_Template_StringGetTemplate::Run()");
        }
        std::__cxx11::string::string
                  ((string *)&local_c0,"{This is perfectly valid} yay!",(allocator *)&local_a0);
        ctemplate::AssertExpandIs(pTVar2,&dict,(string *)&local_c0,true);
        std::__cxx11::string::~string((string *)&local_c0);
        ctemplate::TemplateString::TemplateString(&local_c0,"tgt2");
        ctemplate::TemplateString::TemplateString(&local_a0,"{{This has spaces}}");
        cVar1 = ctemplate::Template::StringToTemplateCache(&local_c0,&local_a0);
        if (cVar1 == '\0') {
          ctemplate::TemplateString::TemplateString(&local_c0,"tgt3");
          ctemplate::TemplateString::TemplateString(&local_a0,"{{#SEC}}foo");
          cVar1 = ctemplate::Template::StringToTemplateCache(&local_c0,&local_a0);
          if (cVar1 == '\0') {
            ctemplate::TemplateString::TemplateString(&local_c0,"tgt4");
            ctemplate::TemplateString::TemplateString(&local_a0,"{{#S1}}foo{{/S2}}");
            cVar1 = ctemplate::Template::StringToTemplateCache(&local_c0,&local_a0);
            if (cVar1 == '\0') {
              ctemplate::TemplateString::TemplateString(&local_c0,"tgt5");
              ctemplate::TemplateString::TemplateString
                        (&local_a0,"{{#S1}}foo{{#S2}}bar{{/S1}{{/S2}");
              cVar1 = ctemplate::Template::StringToTemplateCache(&local_c0,&local_a0);
              if (cVar1 == '\0') {
                ctemplate::TemplateString::TemplateString(&local_c0,"tgt6");
                ctemplate::TemplateString::TemplateString(&local_a0,"{{noend");
                cVar1 = ctemplate::Template::StringToTemplateCache(&local_c0,&local_a0);
                if (cVar1 == '\0') {
                  ctemplate::TemplateString::TemplateString(&local_c0,"tgt2");
                  lVar3 = ctemplate::Template::GetTemplate(&local_c0,STRIP_WHITESPACE);
                  if (lVar3 == 0) {
                    ctemplate::Template::ClearCache();
                    ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
                    return;
                  }
                  printf("ASSERT FAILED, line %d: %s\n",0x4a7,
                         "!Template::GetTemplate(\"tgt2\", STRIP_WHITESPACE)");
                  ctemplate::TemplateString::TemplateString(&local_c0,"tgt2");
                  lVar3 = ctemplate::Template::GetTemplate(&local_c0,STRIP_WHITESPACE);
                  if (lVar3 != 0) {
                    __assert_fail("!Template::GetTemplate(\"tgt2\", STRIP_WHITESPACE)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                                  ,0x4a7,"static void Test_Template_StringGetTemplate::Run()");
                  }
                }
                else {
                  printf("ASSERT FAILED, line %d: %s\n",0x4a5,
                         "!Template::StringToTemplateCache(\"tgt6\", \"{{noend\")");
                  ctemplate::TemplateString::TemplateString(&local_c0,"tgt6");
                  ctemplate::TemplateString::TemplateString(&local_a0,"{{noend");
                  cVar1 = ctemplate::Template::StringToTemplateCache(&local_c0,&local_a0);
                  if (cVar1 != '\0') {
                    __assert_fail("!Template::StringToTemplateCache(\"tgt6\", \"{{noend\")",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                                  ,0x4a5,"static void Test_Template_StringGetTemplate::Run()");
                  }
                }
              }
              else {
                printf("ASSERT FAILED, line %d: %s\n",0x4a4,
                       "!Template::StringToTemplateCache(\"tgt5\", \"{{#S1}}foo{{#S2}}bar{{/S1}{{/S2}\")"
                      );
                ctemplate::TemplateString::TemplateString(&local_c0,"tgt5");
                ctemplate::TemplateString::TemplateString
                          (&local_a0,"{{#S1}}foo{{#S2}}bar{{/S1}{{/S2}");
                cVar1 = ctemplate::Template::StringToTemplateCache(&local_c0,&local_a0);
                if (cVar1 != '\0') {
                  __assert_fail("!Template::StringToTemplateCache(\"tgt5\", \"{{#S1}}foo{{#S2}}bar{{/S1}{{/S2}\")"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                                ,0x4a4,"static void Test_Template_StringGetTemplate::Run()");
                }
              }
            }
            else {
              printf("ASSERT FAILED, line %d: %s\n",0x4a2,
                     "!Template::StringToTemplateCache(\"tgt4\", \"{{#S1}}foo{{/S2}}\")");
              ctemplate::TemplateString::TemplateString(&local_c0,"tgt4");
              ctemplate::TemplateString::TemplateString(&local_a0,"{{#S1}}foo{{/S2}}");
              cVar1 = ctemplate::Template::StringToTemplateCache(&local_c0,&local_a0);
              if (cVar1 != '\0') {
                __assert_fail("!Template::StringToTemplateCache(\"tgt4\", \"{{#S1}}foo{{/S2}}\")",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                              ,0x4a2,"static void Test_Template_StringGetTemplate::Run()");
              }
            }
          }
          else {
            printf("ASSERT FAILED, line %d: %s\n",0x4a1,
                   "!Template::StringToTemplateCache(\"tgt3\", \"{{#SEC}}foo\")");
            ctemplate::TemplateString::TemplateString(&local_c0,"tgt3");
            ctemplate::TemplateString::TemplateString(&local_a0,"{{#SEC}}foo");
            cVar1 = ctemplate::Template::StringToTemplateCache(&local_c0,&local_a0);
            if (cVar1 != '\0') {
              __assert_fail("!Template::StringToTemplateCache(\"tgt3\", \"{{#SEC}}foo\")",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                            ,0x4a1,"static void Test_Template_StringGetTemplate::Run()");
            }
          }
        }
        else {
          printf("ASSERT FAILED, line %d: %s\n",0x4a0,
                 "!Template::StringToTemplateCache(\"tgt2\", \"{{This has spaces}}\")");
          ctemplate::TemplateString::TemplateString(&local_c0,"tgt2");
          ctemplate::TemplateString::TemplateString(&local_a0,"{{This has spaces}}");
          cVar1 = ctemplate::Template::StringToTemplateCache(&local_c0,&local_a0);
          if (cVar1 != '\0') {
            __assert_fail("!Template::StringToTemplateCache(\"tgt2\", \"{{This has spaces}}\")",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                          ,0x4a0,"static void Test_Template_StringGetTemplate::Run()");
          }
        }
      }
      else {
        printf("ASSERT FAILED, line %d: %s\n",0x49a,
               "!Template::StringToTemplateCache(\"tgt\", \"new text\")");
        ctemplate::TemplateString::TemplateString(&local_c0,"tgt");
        ctemplate::TemplateString::TemplateString(&local_a0,"new text");
        cVar1 = ctemplate::Template::StringToTemplateCache(&local_c0,&local_a0);
        if (cVar1 != '\0') {
          __assert_fail("!Template::StringToTemplateCache(\"tgt\", \"new text\")",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                        ,0x49a,"static void Test_Template_StringGetTemplate::Run()");
        }
      }
    }
    else {
      printf("ASSERT FAILED, line %d: %s\n",0x499,
             "!Template::StringToTemplateCache(\"tgt\", tpltext)");
      ctemplate::TemplateString::TemplateString(&local_c0,"tgt");
      ctemplate::TemplateString::TemplateString(&local_a0,"{This is perfectly valid} yay!");
      cVar1 = ctemplate::Template::StringToTemplateCache(&local_c0,&local_a0);
      if (cVar1 != '\0') {
        __assert_fail("!Template::StringToTemplateCache(\"tgt\", tpltext)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                      ,0x499,"static void Test_Template_StringGetTemplate::Run()");
      }
    }
  }
  exit(1);
}

Assistant:

TEST(Template, StringGetTemplate) {
  TemplateDictionary dict("dict");

  // Test cache lookups
  const char* const tpltext = "{This is perfectly valid} yay!";
  ASSERT(Template::StringToTemplateCache("tgt", tpltext));

  Template* tpl1 = Template::GetTemplate("tgt", DO_NOT_STRIP);
  Template* tpl2 = Template::GetTemplate("tgt", STRIP_WHITESPACE);
  ASSERT(tpl1 && tpl2);
  ASSERT(tpl1 != tpl2);
  AssertExpandIs(tpl1, &dict, tpltext, true);
  AssertExpandIs(tpl2, &dict, tpltext, true);

  // If we register a new string under the same text, it should be
  // ignored.
  ASSERT(!Template::StringToTemplateCache("tgt", tpltext));
  ASSERT(!Template::StringToTemplateCache("tgt", "new text"));
  Template* tpl3 = Template::GetTemplate("tgt", DO_NOT_STRIP);
  ASSERT(tpl3 == tpl1);
  AssertExpandIs(tpl3, &dict, tpltext, true);

  // Tests that syntax errors cause us to return NULL
  ASSERT(!Template::StringToTemplateCache("tgt2", "{{This has spaces}}"));
  ASSERT(!Template::StringToTemplateCache("tgt3", "{{#SEC}}foo"));
  ASSERT(!Template::StringToTemplateCache("tgt4", "{{#S1}}foo{{/S2}}"));
  ASSERT(!Template::StringToTemplateCache("tgt5",
                                          "{{#S1}}foo{{#S2}}bar{{/S1}{{/S2}"));
  ASSERT(!Template::StringToTemplateCache("tgt6", "{{noend"));
  // And that we didn't cache them by mistake
  ASSERT(!Template::GetTemplate("tgt2", STRIP_WHITESPACE));

  Template::ClearCache();
}